

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

void board_free(Board *board)

{
  Board *in_RDI;
  uchar i;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar1;
  
  if ((in_RDI->gameState != (void *)0x0) &&
     ((gConfig.game)->freeGameState != (_func_void_Board_ptr *)0x0)) {
    (*(gConfig.game)->freeGameState)(in_RDI);
  }
  for (bVar1 = 0; bVar1 < in_RDI->spotsCount; bVar1 = bVar1 + 1) {
    spot_free((Spot *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  free(in_RDI->spots);
  free(in_RDI);
  return;
}

Assistant:

void board_free(Board * board)
{
	unsigned char i;
	if(board->gameState!=0 && gConfig.game->freeGameState!=0)
		gConfig.game->freeGameState(board);

	for(i=0;i<board->spotsCount;i++)
	{
		spot_free(board->spots[i]);
	}
	free(board->spots);
	free(board);
}